

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O0

ON_3dPoint * __thiscall
ON_BoundingBox::ClosestPoint
          (ON_3dPoint *__return_storage_ptr__,ON_BoundingBox *this,ON_3dPoint *test_point)

{
  double *pdVar1;
  ON_3dPoint *test_point_local;
  ON_BoundingBox *this_local;
  
  __return_storage_ptr__->x = test_point->x;
  __return_storage_ptr__->y = test_point->y;
  __return_storage_ptr__->z = test_point->z;
  if ((this->m_min).x <= test_point->x) {
    if ((this->m_max).x <= test_point->x && test_point->x != (this->m_max).x) {
      __return_storage_ptr__->x = (this->m_max).x;
    }
  }
  else {
    __return_storage_ptr__->x = (this->m_min).x;
  }
  if ((this->m_min).y <= test_point->y) {
    pdVar1 = &(this->m_max).y;
    if (*pdVar1 <= test_point->y && test_point->y != *pdVar1) {
      __return_storage_ptr__->y = (this->m_max).y;
    }
  }
  else {
    __return_storage_ptr__->y = (this->m_min).y;
  }
  if ((this->m_min).z <= test_point->z) {
    pdVar1 = &(this->m_max).z;
    if (*pdVar1 <= test_point->z && test_point->z != *pdVar1) {
      __return_storage_ptr__->z = (this->m_max).z;
    }
  }
  else {
    __return_storage_ptr__->z = (this->m_min).z;
  }
  return __return_storage_ptr__;
}

Assistant:

ON_3dPoint ON_BoundingBox::ClosestPoint( 
  const ON_3dPoint& test_point
  ) const
{
  ON_3dPoint near_point = test_point;
	// GBA  30 March 04.  For performance reasons in closest point to surface
	//this function	no longer validates the bounding box. 
  if ( test_point.x < m_min.x )
    near_point.x = m_min.x;
  else if ( test_point.x > m_max.x )
    near_point.x = m_max.x;
  if ( test_point.y < m_min.y )
    near_point.y = m_min.y;
  else if ( test_point.y > m_max.y )
    near_point.y = m_max.y;
  if ( test_point.z < m_min.z )
    near_point.z = m_min.z;
  else if ( test_point.z > m_max.z )
    near_point.z = m_max.z;
  return near_point;
}